

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent_info::torrent_info
          (torrent_info *this,libtorrent *param_2,char *param_3,load_torrent_limits *cfg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sha1_hash *psVar2;
  sha256_hash *psVar3;
  bool bVar4;
  span<const_char> buffer;
  error_code ec;
  bdecode_node e;
  error_code local_80;
  bdecode_node local_70;
  
  file_storage::file_storage(&this->m_files);
  paVar1 = &(this->m_comment).field_2;
  memset(&this->m_orig_files,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)paVar1;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_info_dict).m_root_tokens = (bdecode_token *)0x0;
  *(undefined8 *)((long)&(this->m_info_dict).m_root_tokens + 4) = 0;
  *(undefined8 *)((long)&(this->m_info_dict).m_buffer + 4) = 0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  (this->m_info_hash).v1.m_number._M_elems[0] = 0;
  (this->m_info_hash).v1.m_number._M_elems[1] = 0;
  psVar2 = &(this->m_info_hash).v1;
  (psVar2->m_number)._M_elems[2] = 0;
  (psVar2->m_number)._M_elems[3] = 0;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = 0;
  psVar3 = &(this->m_info_hash).v2;
  (psVar3->m_number)._M_elems[1] = 0;
  (psVar3->m_number)._M_elems[2] = 0;
  psVar3 = &(this->m_info_hash).v2;
  (psVar3->m_number)._M_elems[3] = 0;
  (psVar3->m_number)._M_elems[4] = 0;
  psVar3 = &(this->m_info_hash).v2;
  (psVar3->m_number)._M_elems[5] = 0;
  (psVar3->m_number)._M_elems[6] = 0;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 7) = 0;
  *(undefined8 *)((long)&this->m_piece_hashes + 1) = 0;
  local_80.val_ = 0;
  local_80.failed_ = false;
  local_80.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  buffer.m_len = (difference_type)&local_80;
  buffer.m_ptr = param_3;
  bdecode(&local_70,param_2,buffer,(error_code *)0x0,(int *)(ulong)(uint)cfg->max_decode_depth,
          cfg->max_decode_tokens,(int)paVar1);
  if (local_80.failed_ == false) {
    bVar4 = parse_torrent_file(this,&local_70,&local_80,cfg);
    if (bVar4) {
      if (local_70.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_80);
}

Assistant:

torrent_info::torrent_info(span<char const> buffer
		, load_torrent_limits const& cfg, from_span_t)
	{
		error_code ec;
		bdecode_node e = bdecode(buffer, ec, nullptr
			, cfg.max_decode_depth, cfg.max_decode_tokens);
		if (ec) aux::throw_ex<system_error>(ec);

		if (!parse_torrent_file(e, ec, cfg))
			aux::throw_ex<system_error>(ec);

		INVARIANT_CHECK;
	}